

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

QVariant * __thiscall
QListWidgetItem::data(QVariant *__return_storage_ptr__,QListWidgetItem *this,int role)

{
  int iVar1;
  long lVar2;
  QVariant *pQVar3;
  
  iVar1 = 0;
  if (role != 2) {
    iVar1 = role;
  }
  lVar2 = (this->d->values).d.size;
  if (lVar2 != 0) {
    pQVar3 = &((this->d->values).d.ptr)->value;
    do {
      if (*(int *)((long)(pQVar3 + -1) + 0x18) == iVar1) {
        ::QVariant::QVariant(__return_storage_ptr__,pQVar3);
        return __return_storage_ptr__;
      }
      pQVar3 = (QVariant *)((long)(pQVar3 + 1) + 8);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QListWidgetItem::data(int role) const
{
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < d->values.size(); ++i)
        if (d->values.at(i).role == role)
            return d->values.at(i).value;
    return QVariant();
}